

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledOutputFile.cpp
# Opt level: O2

void __thiscall
Imf_3_2::DeepTiledOutputFile::updatePreviewImage(DeepTiledOutputFile *this,PreviewRgba *newPixels)

{
  pthread_mutex_t *__mutex;
  PreviewRgba *pPVar1;
  OStream *pOVar2;
  int iVar3;
  TypedAttribute<Imf_3_2::PreviewImage> *pTVar4;
  undefined4 extraout_var;
  ostream *poVar5;
  char *pcVar6;
  LogicExc *this_00;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  stringstream _iex_throw_s;
  ostream local_198 [376];
  
  __mutex = (pthread_mutex_t *)this->_data->_streamData;
  std::mutex::lock((mutex *)&__mutex->__data);
  if (this->_data->previewPosition != 0) {
    pTVar4 = Header::typedAttribute<Imf_3_2::TypedAttribute<Imf_3_2::PreviewImage>>
                       (&this->_data->header,"preview");
    pPVar1 = (pTVar4->_value)._pixels;
    uVar7 = (pTVar4->_value)._height * (pTVar4->_value)._width;
    uVar9 = 0;
    uVar8 = (ulong)uVar7;
    if ((int)uVar7 < 1) {
      uVar8 = uVar9;
    }
    for (; uVar8 != uVar9; uVar9 = uVar9 + 1) {
      pPVar1[uVar9] = newPixels[uVar9];
    }
    iVar3 = (*this->_data->_streamData->os->_vptr_OStream[3])();
    pOVar2 = this->_data->_streamData->os;
    (*pOVar2->_vptr_OStream[4])(pOVar2,this->_data->previewPosition);
    (*(pTVar4->super_Attribute)._vptr_Attribute[4])
              (pTVar4,this->_data->_streamData->os,(ulong)(uint)this->_data->version);
    pOVar2 = this->_data->_streamData->os;
    (*pOVar2->_vptr_OStream[4])(pOVar2,CONCAT44(extraout_var,iVar3));
    pthread_mutex_unlock(__mutex);
    return;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
  poVar5 = std::operator<<(local_198,"Cannot update preview image pixels. File \"");
  pcVar6 = fileName(this);
  poVar5 = std::operator<<(poVar5,pcVar6);
  std::operator<<(poVar5,"\" does not contain a preview image.");
  this_00 = (LogicExc *)__cxa_allocate_exception(0x48);
  Iex_3_2::LogicExc::LogicExc(this_00,(stringstream *)&_iex_throw_s);
  __cxa_throw(this_00,&Iex_3_2::LogicExc::typeinfo,Iex_3_2::LogicExc::~LogicExc);
}

Assistant:

void
DeepTiledOutputFile::updatePreviewImage (const PreviewRgba newPixels[])
{
#if ILMTHREAD_THREADING_ENABLED
    std::lock_guard<std::mutex> lock (*_data->_streamData);
#endif
    if (_data->previewPosition <= 0)
        THROW (
            IEX_NAMESPACE::LogicExc,
            "Cannot update preview image pixels. "
            "File \""
                << fileName ()
                << "\" does not "
                   "contain a preview image.");

    //
    // Store the new pixels in the header's preview image attribute.
    //

    PreviewImageAttribute& pia =
        _data->header.typedAttribute<PreviewImageAttribute> ("preview");

    PreviewImage& pi        = pia.value ();
    PreviewRgba*  pixels    = pi.pixels ();
    int           numPixels = pi.width () * pi.height ();

    for (int i = 0; i < numPixels; ++i)
        pixels[i] = newPixels[i];

    //
    // Save the current file position, jump to the position in
    // the file where the preview image starts, store the new
    // preview image, and jump back to the saved file position.
    //

    uint64_t savedPosition = _data->_streamData->os->tellp ();

    try
    {
        _data->_streamData->os->seekp (_data->previewPosition);
        pia.writeValueTo (*_data->_streamData->os, _data->version);
        _data->_streamData->os->seekp (savedPosition);
    }
    catch (IEX_NAMESPACE::BaseExc& e)
    {
        REPLACE_EXC (
            e,
            "Cannot update preview image pixels for "
            "file \""
                << fileName () << "\". " << e.what ());
        throw;
    }
}